

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O2

QString * __thiscall QStorageInfo::displayName(QString *__return_storage_ptr__,QStorageInfo *this)

{
  QStorageInfoPrivate *pQVar1;
  QArrayDataPointer<char16_t> *other;
  
  pQVar1 = (this->d).d.ptr;
  other = &(pQVar1->name).d;
  if ((pQVar1->name).d.size == 0) {
    other = &(pQVar1->rootPath).d;
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  return __return_storage_ptr__;
}

Assistant:

QString QStorageInfo::displayName() const
{
    if (!d->name.isEmpty())
        return d->name;
    return d->rootPath;
}